

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

void __thiscall VkSpecParser::parseCommands(VkSpecParser *this)

{
  byte bVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  char16_t *str;
  char16_t *str_1;
  Command c;
  parameter_type in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  byte in_stack_fffffffffffffea4;
  undefined1 in_stack_fffffffffffffea5;
  undefined1 uVar4;
  byte in_stack_fffffffffffffea6;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffeb0;
  byte in_stack_fffffffffffffeb4;
  byte in_stack_fffffffffffffeb5;
  byte bVar6;
  QArrayDataPointer<char16_t> local_110 [2];
  undefined1 local_d0 [16];
  VkSpecParser *in_stack_ffffffffffffff40;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    bVar1 = QXmlStreamReader::atEnd();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    QXmlStreamReader::readNext();
    bVar2 = QXmlStreamReader::isEndElement((QXmlStreamReader *)0x103000);
    bVar6 = 0;
    bVar1 = 0;
    uVar5 = false;
    if (bVar2) {
      QXmlStreamReader::name();
      QArrayDataPointer<char16_t>::QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff40,(Data *)0x0,L"commands",8);
      bVar6 = 1;
      QString::QString((QString *)
                       CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffea6,
                                               CONCAT15(in_stack_fffffffffffffea5,
                                                        CONCAT14(in_stack_fffffffffffffea4,
                                                                 in_stack_fffffffffffffea0)))),
                       (DataPointer *)in_stack_fffffffffffffe98);
      bVar1 = 1;
      QStringView::QStringView<QString,_true>
                ((QStringView *)
                 CONCAT17(bVar6,CONCAT16(1,CONCAT15(in_stack_fffffffffffffeb5,
                                                    CONCAT14(in_stack_fffffffffffffeb4,
                                                             in_stack_fffffffffffffeb0)))),in_RDI);
      uVar5 = operator==((QStringView *)
                         CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffea6,
                                                 CONCAT15(in_stack_fffffffffffffea5,
                                                          CONCAT14(in_stack_fffffffffffffea4,
                                                                   in_stack_fffffffffffffea0)))),
                         (QStringView *)in_stack_fffffffffffffe98);
    }
    in_stack_fffffffffffffea6 = uVar5;
    uVar5 = in_stack_fffffffffffffea6;
    if ((bVar1 & 1) != 0) {
      QString::~QString((QString *)0x1030e3);
    }
    if ((bVar6 & 1) != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffea6,
                                         CONCAT15(in_stack_fffffffffffffea5,
                                                  CONCAT14(in_stack_fffffffffffffea4,
                                                           in_stack_fffffffffffffea0)))));
    }
    if ((in_stack_fffffffffffffea6 & 1) != 0) break;
    bVar2 = QXmlStreamReader::isStartElement((QXmlStreamReader *)0x103116);
    in_stack_fffffffffffffeb5 = 0;
    in_stack_fffffffffffffeb4 = 0;
    uVar4 = false;
    if (bVar2) {
      auVar3 = QXmlStreamReader::name();
      local_d0 = auVar3;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_110,(Data *)0x0,L"command",7);
      in_stack_fffffffffffffeb5 = 1;
      QString::QString((QString *)
                       CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffea6,
                                               CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffea4,
                                                                       in_stack_fffffffffffffea0))))
                       ,(DataPointer *)in_stack_fffffffffffffe98);
      in_stack_fffffffffffffeb4 = 1;
      QStringView::QStringView<QString,_true>
                ((QStringView *)
                 CONCAT17(bVar6,CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffffeb5,
                                                        CONCAT14(1,in_stack_fffffffffffffeb0)))),
                 in_RDI);
      uVar4 = operator==((QStringView *)
                         CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffea6,
                                                 CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffea4,
                                                                         in_stack_fffffffffffffea0))
                                                )),(QStringView *)in_stack_fffffffffffffe98);
    }
    in_stack_fffffffffffffea4 = uVar4;
    in_stack_fffffffffffffea5 = in_stack_fffffffffffffea4;
    if ((in_stack_fffffffffffffeb4 & 1) != 0) {
      QString::~QString((QString *)0x1031e7);
    }
    if ((in_stack_fffffffffffffeb5 & 1) != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffea6,
                                         CONCAT15(in_stack_fffffffffffffea5,
                                                  CONCAT14(in_stack_fffffffffffffea4,
                                                           in_stack_fffffffffffffea0)))));
    }
    if ((in_stack_fffffffffffffea4 & 1) != 0) {
      memset(local_70,0xaa,0x68);
      parseCommand(in_stack_ffffffffffffff40);
      bVar2 = QString::isEmpty((QString *)0x10323a);
      if (!bVar2) {
        QList<VkSpecParser::Command>::append
                  ((QList<VkSpecParser::Command> *)
                   CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffea6,
                                           CONCAT15(in_stack_fffffffffffffea5,
                                                    CONCAT14(in_stack_fffffffffffffea4,
                                                             in_stack_fffffffffffffea0)))),
                   in_stack_fffffffffffffe98);
      }
      Command::~Command((Command *)
                        CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffea6,
                                                CONCAT15(in_stack_fffffffffffffea5,
                                                         CONCAT14(in_stack_fffffffffffffea4,
                                                                  in_stack_fffffffffffffea0)))));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VkSpecParser::parseCommands()
{
    // <commands comment="Vulkan command definitions">
    //   <command successcodes="VK_SUCCESS" ...>

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("commands"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("command")) {
            const Command c = parseCommand();
            if (!c.cmd.name.isEmpty()) // skip aliases and commands for another api
                m_commands.append(c);
        }
    }
}